

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

void __thiscall QHeaderViewPrivate::restoreSizeOnPrevLastSection(QHeaderViewPrivate *this)

{
  QHeaderViewPrivate *in_RDI;
  int resizeLogIdx;
  QHeaderView *q;
  QHeaderView *in_stack_00000038;
  int in_stack_00000078;
  int in_stack_0000007c;
  
  q_func(in_RDI);
  if (-1 < in_RDI->lastSectionLogicalIdx) {
    in_RDI->lastSectionLogicalIdx = -1;
    QHeaderView::resizeSection(in_stack_00000038,in_stack_0000007c,in_stack_00000078);
  }
  return;
}

Assistant:

void QHeaderViewPrivate::restoreSizeOnPrevLastSection()
{
    Q_Q(QHeaderView);
    if (lastSectionLogicalIdx < 0)
        return;
    int resizeLogIdx = lastSectionLogicalIdx;
    lastSectionLogicalIdx = -1; // We do not want resize to catch it as the last section.
    q->resizeSection(resizeLogIdx, lastSectionSize);
}